

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

timediff_t Curl_pp_state_timeout(Curl_easy *data,pingpong *pp,_Bool disconnecting)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  timediff_t tVar4;
  curltime cVar5;
  curltime newer;
  curltime older;
  timediff_t local_88;
  timediff_t local_80;
  long local_78;
  long local_68;
  ulong local_58;
  timediff_t total_left_ms;
  timediff_t timeout2_ms;
  curltime now;
  timediff_t response_time;
  timediff_t timeout_ms;
  _Bool disconnecting_local;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  if ((data->set).server_response_timeout == 0) {
    local_58 = pp->response_time;
  }
  else {
    local_58 = (ulong)(data->set).server_response_timeout;
  }
  now._8_8_ = local_58;
  cVar5 = Curl_now();
  uVar3 = now._8_8_;
  timeout2_ms = cVar5.tv_sec;
  now.tv_sec._0_4_ = cVar5.tv_usec;
  uVar1 = (pp->response).tv_sec;
  uVar2 = (pp->response).tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar5._0_12_,0);
  newer.tv_usec = SUB124(cVar5._0_12_,8);
  older._12_4_ = 0;
  tVar4 = Curl_timediff(newer,older);
  response_time = uVar3 - tVar4;
  if (((data->set).timeout != 0) && (!disconnecting)) {
    local_68 = Curl_timeleft(data,(curltime *)&timeout2_ms,false);
    if (response_time < local_68) {
      local_68 = response_time;
    }
    response_time = local_68;
  }
  if (disconnecting) {
    local_88 = Curl_timeleft(data,(curltime *)0x0,false);
    local_78 = local_88;
    if (local_88 < 1) {
      local_78 = 0;
    }
    if (response_time < local_78) {
      local_80 = response_time;
    }
    else {
      if (local_88 < 1) {
        local_88 = 0;
      }
      local_80 = local_88;
    }
    response_time = local_80;
  }
  return response_time;
}

Assistant:

timediff_t Curl_pp_state_timeout(struct Curl_easy *data,
                                 struct pingpong *pp, bool disconnecting)
{
  timediff_t timeout_ms; /* in milliseconds */
  timediff_t response_time = (data->set.server_response_timeout) ?
    data->set.server_response_timeout : pp->response_time;
  struct curltime now = Curl_now();

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time - Curl_timediff(now, pp->response);

  if(data->set.timeout && !disconnecting) {
    /* if timeout is requested, find out how much overall remains */
    timediff_t timeout2_ms = Curl_timeleft(data, &now, FALSE);
    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  if(disconnecting) {
    timediff_t total_left_ms = Curl_timeleft(data, NULL, FALSE);
    timeout_ms = CURLMIN(timeout_ms, CURLMAX(total_left_ms, 0));
  }

  return timeout_ms;
}